

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spawner.cpp
# Opt level: O0

void __thiscall spawner::Spawner::decodeParam<unsigned_int>(Spawner *this,uint i)

{
  uint uVar1;
  char *__format;
  uint i_local;
  Spawner *this_local;
  
  if (this->mReadSz == 4) {
    uVar1 = *(uint *)this->mReadBuff;
    __format = (char *)std::__cxx11::string::c_str();
    snprintf(this->fmtbuf,0x4000,__format,(ulong)uVar1);
    std::operator<<((ostream *)&this->field_0x100300,this->fmtbuf);
    this->mState = Tag;
    this->mReadSz = 0;
  }
  return;
}

Assistant:

void decodeParam(T i)
    {
        if (sizeof(T) == mReadSz)
        {
            std::memcpy(&i, mReadBuff, sizeof(i));
            snprintf(fmtbuf, sizeof(fmtbuf), tokenFormat.c_str(), i);
            // std::cout << "state: " << std::dec << unsigned(mState) << "format: " << tokenFormat.c_str() <<  " value: " << fmtbuf << "\n";
            mSs << fmtbuf;
            mState = State::Tag;
            mReadSz = 0;
        }
    }